

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> * __thiscall
spirv_cross::CompilerGLSL::get_composite_constant_ids
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *__return_storage_ptr__,
          CompilerGLSL *this,ConstantID const_id)

{
  Variant *pVVar1;
  bool bVar2;
  ulong uVar3;
  SPIRConstant *pSVar4;
  SPIRType *type;
  size_type sVar5;
  mapped_type *other;
  CompilerError *this_00;
  ID *init;
  uint32_t local_30;
  uint32_t local_2c;
  
  uVar3 = (ulong)const_id.id;
  if ((uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar3].type == TypeConstant)) {
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar3);
  }
  else {
    pSVar4 = (SPIRConstant *)0x0;
  }
  if (pSVar4 != (SPIRConstant *)0x0) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar4->super_IVariant).field_0xc);
    bVar2 = Compiler::is_array(&this->super_Compiler,type);
    if ((bVar2) || (type->basetype == Struct)) {
      (__return_storage_ptr__->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr =
           (TypedID<(spirv_cross::Types)3> *)0x0;
      (__return_storage_ptr__->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).
      buffer_size = 0;
      (__return_storage_ptr__->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr =
           (TypedID<(spirv_cross::Types)3> *)&__return_storage_ptr__->stack_storage;
      __return_storage_ptr__->buffer_capacity = 8;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
                (__return_storage_ptr__,&pSVar4->subconstants);
    }
    else {
      bVar2 = Compiler::is_matrix(&this->super_Compiler,type);
      if (bVar2) {
        init = (pSVar4->m).id;
      }
      else {
        bVar2 = Compiler::is_vector(&this->super_Compiler,type);
        if (!bVar2) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"Unexpected scalar constant!");
          goto LAB_00333016;
        }
        init = (pSVar4->m).c[0].id;
      }
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul>::
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,4ul>
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul> *)
                 __return_storage_ptr__,(TypedID<(spirv_cross::Types)0> (*) [4])init);
    }
    if (pSVar4 != (SPIRConstant *)0x0) {
      return __return_storage_ptr__;
    }
  }
  local_2c = const_id.id;
  sVar5 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&(this->const_composite_insert_ids)._M_h,&local_2c);
  if (sVar5 != 0) {
    local_30 = const_id.id;
    other = ::std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->const_composite_insert_ids,&local_30);
    (__return_storage_ptr__->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr =
         (TypedID<(spirv_cross::Types)3> *)0x0;
    (__return_storage_ptr__->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).
    buffer_size = 0;
    (__return_storage_ptr__->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr =
         (TypedID<(spirv_cross::Types)3> *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
              (__return_storage_ptr__,other);
    return __return_storage_ptr__;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Unimplemented for this OpSpecConstantOp!");
LAB_00333016:
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SmallVector<ConstantID> CompilerGLSL::get_composite_constant_ids(ConstantID const_id)
{
	if (auto *constant = maybe_get<SPIRConstant>(const_id))
	{
		const auto &type = get<SPIRType>(constant->constant_type);
		if (is_array(type) || type.basetype == SPIRType::Struct)
			return constant->subconstants;
		if (is_matrix(type))
			return SmallVector<ConstantID>(constant->m.id);
		if (is_vector(type))
			return SmallVector<ConstantID>(constant->m.c[0].id);
		SPIRV_CROSS_THROW("Unexpected scalar constant!");
	}
	if (!const_composite_insert_ids.count(const_id))
		SPIRV_CROSS_THROW("Unimplemented for this OpSpecConstantOp!");
	return const_composite_insert_ids[const_id];
}